

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_filehandle.cc
# Opt level: O1

RC __thiscall PF_FileHandle::FlushPages(PF_FileHandle *this)

{
  bool bVar1;
  RC RVar2;
  __off_t _Var3;
  ssize_t sVar4;
  
  if (this->bFileOpen == 0) {
    return 5;
  }
  if (this->bHdrChanged == 0) goto LAB_001062db;
  _Var3 = lseek(this->unixfd,0,0);
  if (_Var3 < 0) {
    return -0xb;
  }
  sVar4 = write(this->unixfd,&this->hdr,8);
  if ((int)(uint)sVar4 < 0) {
    RVar2 = -0xb;
LAB_001062d5:
    bVar1 = false;
  }
  else {
    if (((uint)sVar4 & 0x7fffffff) != 8) {
      RVar2 = -6;
      goto LAB_001062d5;
    }
    this->bHdrChanged = 0;
    bVar1 = true;
    RVar2 = 8;
  }
  if (!bVar1) {
    return RVar2;
  }
LAB_001062db:
  RVar2 = PF_BufferMgr::FlushPages(this->pBufferMgr,this->unixfd);
  return RVar2;
}

Assistant:

RC PF_FileHandle::FlushPages() const
{
   // File must be open
   if (!bFileOpen)
      return (PF_CLOSEDFILE);

   // If the file header has changed, write it back to the file
   if (bHdrChanged) {

      // First seek to the appropriate place
      if (lseek(unixfd, 0, L_SET) < 0)
         return (PF_UNIX);

      // Write header
      int numBytes = write(unixfd,
            (char *)&hdr,
            sizeof(PF_FileHdr));
      if (numBytes < 0)
         return (PF_UNIX);
      if (numBytes != sizeof(PF_FileHdr))
         return (PF_HDRWRITE);

      // This function is declared const, but we need to change the
      // bHdrChanged variable.  Cast away the constness
      PF_FileHandle *dummy = (PF_FileHandle *)this;
      dummy->bHdrChanged = FALSE;
   }

   // Tell Buffer Manager to flush pages
   return (pBufferMgr->FlushPages(unixfd));
}